

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O0

void vera::shader(Shader *_program)

{
  size_t sVar1;
  double dVar2;
  Shader *pSVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  mat<4,_4,_float,_(glm::qualifier)0> *m1;
  mat4 *pmVar7;
  mat3 *_value;
  glm *this;
  size_type sVar8;
  pointer ppVar9;
  undefined4 extraout_var;
  LightType *pLVar10;
  Fbo *pFVar11;
  undefined4 extraout_var_00;
  char *v;
  float fVar12;
  float _y;
  vec<3,_float,_(glm::qualifier)0> vVar13;
  vec4 vVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  undefined1 local_700 [8];
  string name;
  _Self local_6d8;
  iterator it_1;
  string local_6c8;
  allocator local_6a1;
  string local_6a0;
  allocator local_679;
  string local_678;
  allocator local_651;
  string local_650;
  allocator local_629;
  string local_628;
  allocator local_601;
  string local_600;
  allocator local_5d9;
  string local_5d8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
  local_5b8;
  iterator it;
  string local_5a8;
  mat<3,_3,_float,_(glm::qualifier)0> local_588;
  allocator local_561;
  string local_560;
  mat<4,_4,_float,_(glm::qualifier)0> local_53c;
  allocator local_4f9;
  string local_4f8;
  allocator local_4d1;
  string local_4d0;
  mat<4,_4,_float,_(glm::qualifier)0> local_4ac;
  allocator local_469;
  string local_468;
  allocator local_441;
  string local_440;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  allocator local_351;
  string local_350;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  vec3 local_2b8;
  vec3 local_2a8;
  allocator local_299;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  mat<4,_4,_float,_(glm::qualifier)0> local_1fc;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  vec4 local_54 [2];
  allocator local_31;
  string local_30;
  Shader *local_10;
  Shader *_program_local;
  
  if ((shaderPtr != fill_shader) || (shaderPtr != points_shader)) {
    shaderChange = 1;
    shaderPtr = _program;
  }
  _program->textureIndex = 0;
  local_10 = _program;
  Shader::use(_program);
  pSVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"u_date",&local_31);
  vVar14 = getDate();
  local_54[0]._8_8_ = vVar14._8_8_;
  local_54[0]._0_8_ = vVar14._0_8_;
  Shader::setUniform(pSVar3,&local_30,local_54);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pSVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"u_resolution",&local_79);
  iVar5 = getWindowWidth();
  iVar6 = getWindowHeight();
  Shader::setUniform(pSVar3,&local_78,(float)iVar5,(float)iVar6);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pSVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"u_mouse",&local_a1);
  fVar12 = getMouseX();
  _y = getMouseY();
  Shader::setUniform(pSVar3,&local_a0,fVar12,_y);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  pSVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"u_time",&local_c9);
  dVar2 = getTimeSec();
  Shader::setUniform(pSVar3,&local_c8,(float)dVar2);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  pSVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"u_delta",&local_f1);
  dVar2 = getDelta();
  Shader::setUniform(pSVar3,&local_f0,(float)dVar2);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  pSVar3 = local_10;
  if (local_10 == fill_shader) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,"u_color",&local_119);
    Shader::setUniform(pSVar3,&local_118,(vec4 *)&fill_color);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  else if (local_10 == points_shader) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140,"u_size",&local_141);
    Shader::setUniform(pSVar3,&local_140,points_size);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,"u_shape",&local_169);
    Shader::setUniform(pSVar3,&local_168,points_shape);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190,"u_color",&local_191);
    Shader::setUniform(pSVar3,&local_190,(vec4 *)&fill_color);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    glEnable(0x8861);
    glEnable(0x8642);
  }
  pSVar3 = local_10;
  if (*(long *)(scene + 0x1f0) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_468,"u_modelViewProjectionMatrix",&local_469);
    pmVar7 = getFlippedOrthoMatrix();
    glm::operator*(&local_4ac,pmVar7,(mat<4,_4,_float,_(glm::qualifier)0> *)matrix_world);
    Shader::setUniform(pSVar3,&local_468,&local_4ac,false);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4d0,"u_projectionMatrix",&local_4d1);
    pmVar7 = getFlippedOrthoMatrix();
    Shader::setUniform(pSVar3,&local_4d0,pmVar7,false);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4f8,"u_viewMatrix",&local_4f9);
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(&local_53c,1.0);
    Shader::setUniform(pSVar3,&local_4f8,&local_53c,false);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_560,"u_normalMatrix",&local_561);
    glm::mat<3,_3,_float,_(glm::qualifier)0>::mat(&local_588,1.0);
    Shader::setUniform(pSVar3,&local_560,&local_588,false);
    std::__cxx11::string::~string((string *)&local_560);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,"u_modelViewProjectionMatrix",&local_1b9);
    m1 = (mat<4,_4,_float,_(glm::qualifier)0> *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2d0))();
    glm::operator*(&local_1fc,m1,(mat<4,_4,_float,_(glm::qualifier)0> *)matrix_world);
    Shader::setUniform(pSVar3,&local_1b8,&local_1fc,false);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_220,"u_projectionMatrix",&local_221);
    pmVar7 = (mat4 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2c8))();
    Shader::setUniform(pSVar3,&local_220,pmVar7,false);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_248,"u_normalMatrix",&local_249);
    _value = (mat3 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2b8))();
    Shader::setUniform(pSVar3,&local_248,_value,false);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_270,"u_viewMatrix",&local_271);
    pmVar7 = (mat4 *)(**(code **)(**(long **)(scene + 0x1f0) + 0x2b0))();
    Shader::setUniform(pSVar3,&local_270,pmVar7,false);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    v = "u_camera";
    std::__cxx11::string::string((string *)&local_298,"u_camera",&local_299);
    this = (glm *)(**(code **)(**(long **)(scene + 0x1f0) + 0x98))();
    vVar13 = glm::operator-(this,(vec<3,_float,_(glm::qualifier)0> *)v);
    local_2b8.field_2 = vVar13.field_2;
    local_2b8._0_8_ = vVar13._0_8_;
    local_2a8._0_8_ = local_2b8._0_8_;
    local_2a8.field_2 = local_2b8.field_2;
    Shader::setUniform(pSVar3,&local_298,&local_2a8);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2d8,"u_cameraDistance",&local_2d9);
    fVar12 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x278))();
    Shader::setUniform(pSVar3,&local_2d8,fVar12);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_300,"u_cameraNearClip",&local_301);
    fVar12 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x270))();
    Shader::setUniform(pSVar3,&local_300,fVar12);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_328,"u_cameraFarClip",&local_329);
    fVar12 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x268))();
    Shader::setUniform(pSVar3,&local_328,fVar12);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_350,"u_cameraEv100",&local_351);
    fVar12 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x280))();
    Shader::setUniform(pSVar3,&local_350,fVar12);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_378,"u_cameraExposure",&local_379);
    dVar2 = (double)(**(code **)(**(long **)(scene + 0x1f0) + 0x288))();
    Shader::setUniform(pSVar3,&local_378,(float)dVar2);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"u_cameraAperture",&local_3a1);
    fVar12 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x290))();
    Shader::setUniform(pSVar3,&local_3a0,fVar12);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c8,"u_cameraShutterSpeed",&local_3c9);
    fVar12 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x298))();
    Shader::setUniform(pSVar3,&local_3c8,fVar12);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,"u_cameraSensitivity",&local_3f1);
    fVar12 = (float)(**(code **)(**(long **)(scene + 0x1f0) + 0x2a0))();
    Shader::setUniform(pSVar3,&local_3f0,fVar12);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_418,"u_cameraChange",&local_419);
    Shader::setUniform(pSVar3,&local_418,*(byte *)(*(long *)(scene + 0x1f0) + 0x20) & 1);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    pSVar3 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_440,"u_iblLuminance",&local_441);
    dVar2 = (double)(**(code **)(**(long **)(scene + 0x1f0) + 0x288))();
    Shader::setUniform(pSVar3,&local_440,(float)(dVar2 * 30000.0));
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator((allocator<char> *)&local_441);
  }
  pSVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a8,"u_modelMatrix",(allocator *)((long)&it._M_node + 7));
  Shader::setUniform(pSVar3,&local_5a8,(mat4 *)matrix_world,false);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
  if ((lights_enabled & 1) == 0) {
    return;
  }
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
                  *)(scene + 200));
  if (sVar8 != 1) {
    local_6d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
                  *)(scene + 200));
    do {
      name.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
                  *)(scene + 200));
      bVar4 = std::operator!=(&local_6d8,(_Self *)((long)&name.field_2 + 8));
      if (!bVar4) {
        return;
      }
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
               ::operator->(&local_6d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700,
                     "u_",&ppVar9->first);
      pSVar3 = local_10;
      std::operator+(&local_720,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700,
                     "Color");
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
               ::operator->(&local_6d8);
      Shader::setUniform(pSVar3,&local_720,&ppVar9->second->color);
      std::__cxx11::string::~string((string *)&local_720);
      pSVar3 = local_10;
      std::operator+(&local_740,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700,
                     "Intensity");
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
               ::operator->(&local_6d8);
      Shader::setUniform(pSVar3,&local_740,ppVar9->second->intensity);
      std::__cxx11::string::~string((string *)&local_740);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
               ::operator->(&local_6d8);
      pLVar10 = Light::getLightType(ppVar9->second);
      pSVar3 = local_10;
      if (*pLVar10 != LIGHT_DIRECTIONAL) {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                 ::operator->(&local_6d8);
        iVar5 = (*(ppVar9->second->super_Node)._vptr_Node[0x13])();
        Shader::setUniform(pSVar3,(string *)local_700,(vec3 *)CONCAT44(extraout_var_00,iVar5));
      }
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
               ::operator->(&local_6d8);
      pLVar10 = Light::getLightType(ppVar9->second);
      if (*pLVar10 == LIGHT_DIRECTIONAL) {
LAB_00416862:
        pSVar3 = local_10;
        std::operator+(&local_760,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_700,"Direction");
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                 ::operator->(&local_6d8);
        Shader::setUniform(pSVar3,&local_760,&ppVar9->second->direction);
        std::__cxx11::string::~string((string *)&local_760);
      }
      else {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                 ::operator->(&local_6d8);
        pLVar10 = Light::getLightType(ppVar9->second);
        if (*pLVar10 == LIGHT_SPOT) goto LAB_00416862;
      }
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
               ::operator->(&local_6d8);
      pSVar3 = local_10;
      if (0.0 < ppVar9->second->falloff) {
        std::operator+(&local_780,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_700,"Falloff");
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                 ::operator->(&local_6d8);
        Shader::setUniform(pSVar3,&local_780,ppVar9->second->falloff);
        std::__cxx11::string::~string((string *)&local_780);
      }
      pSVar3 = local_10;
      std::operator+(&local_7a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700,
                     "Matrix");
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
               ::operator->(&local_6d8);
      pmVar7 = Light::getBiasMVPMatrix(ppVar9->second);
      Shader::setUniform(pSVar3,&local_7a0,pmVar7,false);
      std::__cxx11::string::~string((string *)&local_7a0);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
               ::operator->(&local_6d8);
      pFVar11 = Light::getShadowMap(ppVar9->second);
      bVar4 = Fbo::isAllocated(pFVar11);
      pSVar3 = local_10;
      if (bVar4) {
        std::operator+(&local_7c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_700,"ShadowMap");
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                 ::operator->(&local_6d8);
        pFVar11 = Light::getShadowMap(ppVar9->second);
        sVar1 = local_10->textureIndex;
        local_10->textureIndex = sVar1 + 1;
        Shader::setUniformDepthTexture(pSVar3,&local_7c0,pFVar11,sVar1);
        std::__cxx11::string::~string((string *)&local_7c0);
      }
      std::__cxx11::string::~string((string *)local_700);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
      ::operator++(&local_6d8);
    } while( true );
  }
  local_5b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
                *)(scene + 200));
  pSVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d8,"u_lightColor",&local_5d9);
  ppVar9 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
           ::operator->(&local_5b8);
  Shader::setUniform(pSVar3,&local_5d8,&ppVar9->second->color);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  pSVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_600,"u_lightIntensity",&local_601);
  ppVar9 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
           ::operator->(&local_5b8);
  Shader::setUniform(pSVar3,&local_600,ppVar9->second->intensity);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  pSVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_628,"u_light",&local_629);
  ppVar9 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
           ::operator->(&local_5b8);
  iVar5 = (*(ppVar9->second->super_Node)._vptr_Node[0x13])();
  Shader::setUniform(pSVar3,&local_628,(vec3 *)CONCAT44(extraout_var,iVar5));
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  ppVar9 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
           ::operator->(&local_5b8);
  pLVar10 = Light::getLightType(ppVar9->second);
  if (*pLVar10 != LIGHT_DIRECTIONAL) {
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
             ::operator->(&local_5b8);
    pLVar10 = Light::getLightType(ppVar9->second);
    if (*pLVar10 != LIGHT_SPOT) goto LAB_00416366;
  }
  pSVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_650,"u_lightDirection",&local_651);
  ppVar9 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
           ::operator->(&local_5b8);
  Shader::setUniform(pSVar3,&local_650,&ppVar9->second->direction);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
LAB_00416366:
  ppVar9 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
           ::operator->(&local_5b8);
  pSVar3 = local_10;
  if (0.0 < ppVar9->second->falloff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_678,"u_lightFalloff",&local_679);
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
             ::operator->(&local_5b8);
    Shader::setUniform(pSVar3,&local_678,ppVar9->second->falloff);
    std::__cxx11::string::~string((string *)&local_678);
    std::allocator<char>::~allocator((allocator<char> *)&local_679);
  }
  pSVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a0,"u_lightMatrix",&local_6a1);
  ppVar9 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
           ::operator->(&local_5b8);
  pmVar7 = Light::getBiasMVPMatrix(ppVar9->second);
  Shader::setUniform(pSVar3,&local_6a0,pmVar7,false);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  ppVar9 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
           ::operator->(&local_5b8);
  pFVar11 = Light::getShadowMap(ppVar9->second);
  bVar4 = Fbo::isAllocated(pFVar11);
  pSVar3 = local_10;
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_6c8,"u_lightShadowMap",(allocator *)((long)&it_1._M_node + 7));
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
             ::operator->(&local_5b8);
    pFVar11 = Light::getShadowMap(ppVar9->second);
    sVar1 = local_10->textureIndex;
    local_10->textureIndex = sVar1 + 1;
    Shader::setUniformDepthTexture(pSVar3,&local_6c8,pFVar11,sVar1);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_node + 7));
  }
  return;
}

Assistant:

void shader(Shader* _program) {
    if (shaderPtr != fill_shader || shaderPtr != points_shader) {
        shaderPtr = _program; 
        shaderChange = true;
    }

    _program->textureIndex = 0;
    _program->use();

    _program->setUniform("u_date", getDate() );
    _program->setUniform("u_resolution", (float)getWindowWidth(), (float)getWindowHeight() );
    _program->setUniform("u_mouse", (float)getMouseX(), (float)getMouseY() );
    _program->setUniform("u_time", (float)getTimeSec() );
    _program->setUniform("u_delta", (float)getDelta() );

    if (_program == fill_shader)
        _program->setUniform("u_color", fill_color);
    else if (_program == points_shader) {
        _program->setUniform("u_size", points_size);
        _program->setUniform("u_shape", points_shape);
        _program->setUniform("u_color", fill_color);
        #if !defined(PLATFORM_RPI) && !defined(DRIVER_GBM) && !defined(_WIN32) && !defined(__EMSCRIPTEN__)
        glEnable(GL_POINT_SPRITE);
        glEnable(GL_VERTEX_PROGRAM_POINT_SIZE);
        #endif
    }

    if (scene->activeCamera) {
        _program->setUniform("u_modelViewProjectionMatrix", scene->activeCamera->getProjectionViewMatrix() * matrix_world );
        _program->setUniform("u_projectionMatrix", scene->activeCamera->getProjectionMatrix());
        _program->setUniform("u_normalMatrix", scene->activeCamera->getNormalMatrix());
        _program->setUniform("u_viewMatrix", scene->activeCamera->getViewMatrix() );

        _program->setUniform("u_camera", -scene->activeCamera->getPosition() );
        _program->setUniform("u_cameraDistance", scene->activeCamera->getDistance());
        _program->setUniform("u_cameraNearClip", scene->activeCamera->getNearClip());
        _program->setUniform("u_cameraFarClip", scene->activeCamera->getFarClip());
        _program->setUniform("u_cameraEv100", scene->activeCamera->getEv100());
        _program->setUniform("u_cameraExposure", float(scene->activeCamera->getExposure()));
        _program->setUniform("u_cameraAperture", scene->activeCamera->getAperture());
        _program->setUniform("u_cameraShutterSpeed", scene->activeCamera->getShutterSpeed());
        _program->setUniform("u_cameraSensitivity", scene->activeCamera->getSensitivity());
        _program->setUniform("u_cameraChange", scene->activeCamera->bChange);
        _program->setUniform("u_iblLuminance", float(30000.0f * scene->activeCamera->getExposure()));
    }
    else {
        _program->setUniform("u_modelViewProjectionMatrix", getFlippedOrthoMatrix() * matrix_world );
        _program->setUniform("u_projectionMatrix", getFlippedOrthoMatrix() );
        _program->setUniform("u_viewMatrix", glm::mat4(1.0f) );
        _program->setUniform("u_normalMatrix", glm::mat3(1.0f) );
    }

    _program->setUniform("u_modelMatrix", matrix_world );

    if (lights_enabled) {
        // Pass Light Uniforms
        if (scene->lights.size() == 1) {
            LightsMap::iterator it = scene->lights.begin();

            _program->setUniform("u_lightColor", it->second->color);
            _program->setUniform("u_lightIntensity", it->second->intensity);

            // if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
            _program->setUniform("u_light", it->second->getPosition());
            if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                _program->setUniform("u_lightDirection", it->second->direction);
            if (it->second->falloff > 0)
                _program->setUniform("u_lightFalloff", it->second->falloff);

            _program->setUniform("u_lightMatrix", it->second->getBiasMVPMatrix() );

            if (it->second->getShadowMap()->isAllocated())
                _program->setUniformDepthTexture("u_lightShadowMap", it->second->getShadowMap(), _program->textureIndex++ );
        }
        else {
            for (LightsMap::iterator it = scene->lights.begin(); it != scene->lights.end(); ++it) {
                std::string name = "u_" + it->first;

                _program->setUniform(name + "Color", it->second->color);
                _program->setUniform(name + "Intensity", it->second->intensity);
                if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
                    _program->setUniform(name, it->second->getPosition());
                if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                    _program->setUniform(name + "Direction", it->second->direction);
                if (it->second->falloff > 0)
                    _program->setUniform(name +"Falloff", it->second->falloff);

                _program->setUniform(name + "Matrix", it->second->getBiasMVPMatrix() );

                if (it->second->getShadowMap()->isAllocated())
                    _program->setUniformDepthTexture(name + "ShadowMap", it->second->getShadowMap(), _program->textureIndex++ );
            }
        } 
    }
}